

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpMapMatrix.cpp
# Opt level: O2

Matrix<double,_3,_9,_0,_3,_9> *
mnf::ExpMapMatrix::diffPseudoLog0_
          (Matrix<double,_3,_9,_0,_3,_9> *__return_storage_ptr__,ConstRefVec *R)

{
  CoeffReturnType CVar1;
  CoeffReturnType CVar2;
  CoeffReturnType CVar3;
  CoeffReturnType CVar4;
  double dVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  PointerType pdVar10;
  undefined1 auVar11 [16];
  PointerType local_f8;
  undefined1 local_c8 [8];
  double dStack_c0;
  scalar_constant_op<double> local_b8;
  BlockImpl_dense<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true,_true> local_98;
  undefined1 local_68 [16];
  double local_58;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  double local_20;
  
  Eigen::DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)__return_storage_ptr__);
  CVar1 = Eigen::
          DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                        *)R,5);
  CVar2 = Eigen::
          DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                        *)R,7);
  CVar3 = Eigen::
          DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                        *)R,6);
  local_38._8_4_ = extraout_XMM0_Dc;
  local_38._0_8_ = CVar3;
  local_38._12_4_ = extraout_XMM0_Dd;
  CVar3 = Eigen::
          DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                        *)R,2);
  local_48._8_4_ = extraout_XMM0_Dc_00;
  local_48._0_8_ = CVar3;
  local_48._12_4_ = extraout_XMM0_Dd_00;
  CVar3 = Eigen::
          DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                        *)R,1);
  CVar4 = Eigen::
          DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                        *)R,3);
  dVar6 = (CVar3 - CVar4) * 0.5;
  dVar8 = ((double)local_38._0_8_ - (double)local_48._0_8_) * 0.5;
  local_68._8_4_ = SUB84(dVar8,0);
  local_68._0_8_ = (CVar1 - CVar2) * 0.5;
  local_68._12_4_ = (int)((ulong)dVar8 >> 0x20);
  local_58 = dVar6;
  CVar1 = Eigen::
          DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                        *)R,0);
  CVar2 = Eigen::
          DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                        *)R,4);
  CVar3 = Eigen::
          DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                        *)R,8);
  dVar8 = CVar3 + CVar2 + CVar1;
  dVar7 = (dVar8 + -1.0) * 0.5;
  dVar5 = acos(dVar7);
  dVar5 = boost::math::detail::sinc_pi_imp<double>(dVar5);
  if (1e-10 <= dVar6 * dVar6 +
               (double)local_68._8_8_ * (double)local_68._8_8_ +
               (double)local_68._0_8_ * (double)local_68._0_8_) {
    dVar8 = 1.0 - dVar7 * dVar7;
    local_20 = (dVar7 * (1.0 / dVar5) + -1.0) / (dVar8 + dVar8);
  }
  else {
    dVar6 = dVar8 + -3.0;
    dVar7 = dVar6 * dVar6 * dVar6;
    auVar11._8_8_ = dVar6 * dVar6 * 3.0;
    auVar11._0_8_ = dVar8;
    auVar11 = divpd(auVar11,_DAT_00177130);
    auVar9._0_8_ = dVar7 * 2.0;
    auVar9._8_8_ = dVar6 * dVar7 * 5.0;
    auVar9 = divpd(auVar9,_DAT_00177150);
    local_20 = ((auVar11._0_8_ - auVar11._8_8_) + auVar9._0_8_) - auVar9._8_8_;
  }
  pdVar10 = (PointerType)((1.0 / dVar5) * 0.5);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_c8,&local_20,(StorageBaseType *)local_68);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true,_true>::
  BlockImpl_dense(&local_98,__return_storage_ptr__,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Block<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true> *)&local_98,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_c8);
  local_c8 = (undefined1  [8])0x0;
  dStack_c0 = 0.0;
  local_b8.m_other = (double)pdVar10;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true,_true>::
  BlockImpl_dense(&local_98,__return_storage_ptr__,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true> *)&local_98,
             (Matrix<double,_3,_1,_0,_3,_1> *)local_c8);
  local_f8 = (PointerType)-(double)pdVar10;
  local_c8 = (undefined1  [8])0x0;
  dStack_c0 = -(double)pdVar10;
  local_b8.m_other = 0.0;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true,_true>::
  BlockImpl_dense(&local_98,__return_storage_ptr__,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true> *)&local_98,
             (Matrix<double,_3,_1,_0,_3,_1> *)local_c8);
  local_c8 = (undefined1  [8])0x0;
  dStack_c0 = 0.0;
  local_b8.m_other = (double)local_f8;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true,_true>::
  BlockImpl_dense(&local_98,__return_storage_ptr__,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true> *)&local_98,
             (Matrix<double,_3,_1,_0,_3,_1> *)local_c8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true,_true>::
  BlockImpl_dense(&local_98,__return_storage_ptr__,0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true,_true> *)
                  local_c8,__return_storage_ptr__,4);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true>,Eigen::Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true>>
            ((Block<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true> *)local_c8,
             (Block<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true> *)&local_98);
  dStack_c0 = 0.0;
  local_b8.m_other = 0.0;
  local_c8 = (undefined1  [8])pdVar10;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true,_true>::
  BlockImpl_dense(&local_98,__return_storage_ptr__,5);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true> *)&local_98,
             (Matrix<double,_3,_1,_0,_3,_1> *)local_c8);
  local_c8 = (undefined1  [8])0x0;
  local_b8.m_other = 0.0;
  dStack_c0 = (double)pdVar10;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true,_true>::
  BlockImpl_dense(&local_98,__return_storage_ptr__,6);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true> *)&local_98,
             (Matrix<double,_3,_1,_0,_3,_1> *)local_c8);
  local_c8 = (undefined1  [8])local_f8;
  dStack_c0 = 0.0;
  local_b8.m_other = 0.0;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true,_true>::
  BlockImpl_dense(&local_98,__return_storage_ptr__,7);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true> *)&local_98,
             (Matrix<double,_3,_1,_0,_3,_1> *)local_c8);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true,_true>::
  BlockImpl_dense(&local_98,__return_storage_ptr__,0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true,_true> *)
                  local_c8,__return_storage_ptr__,8);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true>,Eigen::Block<Eigen::Matrix<double,3,9,0,3,9>,3,1,true>>
            ((Block<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true> *)local_c8,
             (Block<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_3,_1,_true> *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix<double, 3, 9> ExpMapMatrix::diffPseudoLog0_(const ConstRefVec& R)
{
  Eigen::Matrix<double, 3, 9> J;
  J.setZero();
  // Valid approximation of the log when v<<1
  Eigen::Vector3d v((R(5) - R(7)) / 2, (R(6) - R(2)) / 2, (R(1) - R(3)) / 2);

  double trR = R(0) + R(4) + R(8);  // Trace of R;
  double trRm1o2 = (trR - 1) / 2;
  double s2 = 1 - trRm1o2 * trRm1o2;
  double f = 1 / boost::math::sinc_pi(
                     acos(trRm1o2));  //=acos(trRm1o2)/sin(acos(trRm1o2));
  double hf = f / 2;
  double df;
  if (v.squaredNorm() < 1e-10)  // Probably should not use this switch value
                                // here
  {
    // TODO: I do not know how to test that. Verification with finite
    // differences proved unefficient. Need to get back to it later.
    //
    // Here we use the Taylor approximation of the diff of the log
    double x = trR - 3;
    df = trR / 15 - (3 * (x * x)) / 140 + (2 * (x * x * x)) / 315 -
         (5 * (x * x * x * x)) / 2772 - 11 / 30;
  }
  else
  {
    df = (trRm1o2 * f - 1) / (2 * s2);
  }
  J.col(0) = df * v;
  J.col(1) = Eigen::Vector3d(0, 0, hf);
  J.col(2) = Eigen::Vector3d(0, -hf, 0);
  J.col(3) = Eigen::Vector3d(0, 0, -hf);
  J.col(4) = J.col(0);
  J.col(5) = Eigen::Vector3d(hf, 0, 0);
  J.col(6) = Eigen::Vector3d(0, hf, 0);
  J.col(7) = Eigen::Vector3d(-hf, 0, 0);
  J.col(8) = J.col(0);
  return J;
}